

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedersen_impl.h
# Opt level: O2

void secp256k1_pedersen_ecmult_small(secp256k1_gej *r,uint64_t gn,secp256k1_ge *genp)

{
  long lVar1;
  uchar local_58 [32];
  secp256k1_scalar local_38;
  
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 1) {
    local_58[lVar1] = '\0';
  }
  for (lVar1 = 0x18; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    local_58[lVar1] = (uchar)(gn >> 0x38);
    gn = gn << 8;
  }
  secp256k1_scalar_set_b32((secp256k1_scalar *)(local_58 + 0x20),local_58,(int *)0x0);
  secp256k1_ecmult_const(r,genp,(secp256k1_scalar *)(local_58 + 0x20),0x40);
  return;
}

Assistant:

static void secp256k1_pedersen_ecmult_small(secp256k1_gej *r, uint64_t gn, const secp256k1_ge* genp) {
    secp256k1_scalar s;
    secp256k1_pedersen_scalar_set_u64(&s, gn);
    secp256k1_ecmult_const(r, genp, &s, 64);
    secp256k1_scalar_clear(&s);
}